

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::CreateDstUntransferredValue
          (GlobOpt *this,ValueType desiredValueType,Instr *instr,Value *src1Value,Value *src2Value)

{
  code *pcVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType desiredValueType_local;
  
  local_32[0] = desiredValueType.field_0;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16ae,"(instr)","instr");
    if (!bVar2) goto LAB_0042e02f;
    *puVar4 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16af,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) goto LAB_0042e02f;
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsInt((ValueType *)&local_32[0].field_0);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16b0,"(!desiredValueType.IsInt())","!desiredValueType.IsInt()");
    if (!bVar2) {
LAB_0042e02f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  aVar3 = local_32[0];
  if (this->prePassLoop != (Loop *)0x0) {
    pVVar5 = (Value *)0x0;
    bVar2 = IsPrepassSrcValueInfoPrecise(this,instr,src1Value,src2Value,(bool *)0x0);
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetPrepassValueTypeForDst(this,aVar3.field_0,instr,src2Value,pVVar5,bVar2,false);
  }
  pVVar5 = NewGenericValue(this,(ValueType)aVar3.field_0,instr->m_dst);
  return pVVar5;
}

Assistant:

Value *
GlobOpt::CreateDstUntransferredValue(
    const ValueType desiredValueType,
    IR::Instr *const instr,
    Value *const src1Value,
    Value *const src2Value)
{
    Assert(instr);
    Assert(instr->GetDst());
    Assert(!desiredValueType.IsInt()); // use CreateDstUntransferredIntValue instead

    ValueType valueType(desiredValueType);
    if(IsLoopPrePass())
    {
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value));
    }
    return NewGenericValue(valueType, instr->GetDst());
}